

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Range *range)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  allocator<char> local_191;
  ostringstream ss;
  undefined8 auStack_180 [45];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  iVar4 = range->cyl_begin;
  iVar1 = range->cyl_end;
  if ((iVar1 <= iVar4) || (range->head_end <= range->head_begin)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"All Tracks",&local_191);
    goto LAB_0016e1b2;
  }
  if (iVar1 - iVar4 == 1) {
    poVar2 = std::operator<<((ostream *)&ss,"Cyl ");
    pcVar3 = CylStr(range->cyl_begin);
LAB_0016e12f:
    std::operator<<(poVar2,pcVar3);
    pcVar3 = ", ";
  }
  else {
    if (iVar4 != 0) {
      poVar2 = std::operator<<((ostream *)&ss,"Cyls ");
      pcVar3 = CylStr(range->cyl_begin);
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,'-');
      pcVar3 = CylStr(range->cyl_end + -1);
      goto LAB_0016e12f;
    }
    *(undefined8 *)((long)auStack_180 + *(long *)(_ss + -0x18)) = 2;
    poVar2 = (ostream *)std::ostream::operator<<(&ss,iVar1);
    std::operator<<(poVar2," Cyls");
    pcVar3 = " ";
  }
  if (range->head_end - range->head_begin == 1) {
    poVar2 = std::operator<<((ostream *)&ss," Head ");
    iVar4 = range->head_begin;
LAB_0016e19d:
    std::ostream::operator<<(poVar2,iVar4);
  }
  else {
    if (range->head_begin != 0) {
      poVar2 = std::operator<<((ostream *)&ss," Heads ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,range->head_begin);
      poVar2 = std::operator<<(poVar2,'-');
      iVar4 = range->head_end + -1;
      goto LAB_0016e19d;
    }
    poVar2 = std::operator<<((ostream *)&ss,pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,range->head_end);
    std::operator<<(poVar2," Heads");
  }
  std::__cxx11::stringbuf::str();
LAB_0016e1b2:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Range& range)
{
    std::ostringstream ss;
    auto separator = ", ";

    if (range.empty())
        return "All Tracks";

    if (range.cyls() == 1)
        ss << "Cyl " << CylStr(range.cyl_begin);
    else if (range.cyl_begin == 0)
    {
        ss << std::setw(2) << range.cyl_end << " Cyls";
        separator = " ";
    }
    else
        ss << "Cyls " << CylStr(range.cyl_begin) << '-' << CylStr(range.cyl_end - 1);

    if (range.heads() == 1)
        ss << " Head " << range.head_begin;
    else if (range.head_begin == 0)
        ss << separator << range.head_end << " Heads";
    else
        ss << " Heads " << range.head_begin << '-' << (range.head_end - 1);

    return ss.str();
}